

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::~echo_server(echo_server *this)

{
  echo_server *this_local;
  
  std::
  set<ranger::event::tcp_connection,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::~set(&this->m_conn_set);
  ranger::event::tcp_acceptor::~tcp_acceptor(&this->m_acc);
  ranger::event::dispatcher::~dispatcher(&this->m_disp);
  return;
}

Assistant:

explicit echo_server(int port)
		: m_acc(m_disp, ranger::event::endpoint(port)) {
		m_acc.set_event_handler([this] (ranger::event::tcp_acceptor& acc, int fd) {
			ranger::event::tcp_connection conn(m_disp, fd);
			conn.set_event_handler([this] (ranger::event::tcp_connection& conn, ranger::event::tcp_connection::event_code what) {
				switch (what) {
				case ranger::event::tcp_connection::event_code::read:
					handle_read(conn, conn.read_buffer());
					break;
				case ranger::event::tcp_connection::event_code::timeout:
					handle_timeout(conn);
					break;
				case ranger::event::tcp_connection::event_code::error:
					handle_error(conn);
					break;
				case ranger::event::tcp_connection::event_code::eof:
					handle_eof(conn);
					break;
				default:
					break;
				}
			});

			auto local_ep = acc.local_endpoint();
			auto remote_ep = conn.remote_endpoint();
			std::cout << "acceptor[" << local_ep << "]" << " accept connection[" << remote_ep << "]." << std::endl;

			m_conn_set.emplace(std::move(conn));

			return true;
		});
	}